

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolve
          (Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  StringPtr name_00;
  StringPtr name_01;
  bool bVar1;
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  *other;
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  *pOVar2;
  OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
  *t;
  unsigned_long *puVar3;
  Impl *this_00;
  ResolvedDecl local_340;
  undefined1 local_2e0 [8];
  ResolveResult result_1;
  Maybe<capnp::compiler::Compiler::Node_&> local_268;
  Node *local_260;
  Node *b;
  char *local_250;
  Node *local_248;
  Node *p;
  uint local_238;
  undefined1 local_230 [8];
  ResolveResult result;
  ArrayPtr<const_char> local_198;
  uint local_184;
  Iterator IStack_180;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_long> *__range2;
  Reader params;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_108;
  undefined1 local_98 [8];
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  member;
  Node *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (Node *)name.content.ptr;
  member.field_1._96_8_ = this;
  name_local.content.size_ = (size_t)__return_storage_ptr__;
  resolveMember(&local_108,this,name);
  other = kj::_::
          readMaybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>>
                    (&local_108);
  kj::_::
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  ::NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                   *)local_98,other);
  kj::
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  ::~Maybe(&local_108);
  pOVar2 = kj::_::NullableValue::operator_cast_to_OneOf_((NullableValue *)local_98);
  if (pOVar2 != (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                 *)0x0) {
    t = kj::_::
        NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
        ::operator*((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                     *)local_98);
    kj::
    Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
    ::Maybe(__return_storage_ptr__,t);
  }
  params.reader.nestingLimit =
       (int)(pOVar2 !=
            (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
             *)0x0);
  kj::_::
  NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  ::~NullableValue((NullableValue<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
                    *)local_98);
  if (params.reader.nestingLimit == 0) {
    Declaration::Reader::getParameters((Reader *)&__range2,&this->declaration);
    ___begin2 = kj::
                indices<capnp::List<capnp::compiler::Declaration::BrandParameter,(capnp::Kind)3>::Reader&>
                          ((Reader *)&__range2);
    __end2 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin2);
    IStack_180 = kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin2);
    while (bVar1 = kj::Range<unsigned_long>::Iterator::operator!=(&__end2,&stack0xfffffffffffffe80),
          bVar1) {
      puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end2);
      local_184 = (uint)*puVar3;
      List<capnp::compiler::Declaration::BrandParameter,_(capnp::Kind)3>::Reader::operator[]
                ((Reader *)((long)&result.field_1 + 0x58),(Reader *)&__range2,local_184);
      local_198 = (ArrayPtr<const_char>)
                  Declaration::BrandParameter::Reader::getName
                            ((Reader *)((long)&result.field_1 + 0x58));
      bVar1 = kj::StringPtr::operator==((StringPtr *)&local_198,(StringPtr *)&this_local);
      if (bVar1) {
        kj::
        OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
        ::OneOf((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                 *)local_230);
        p = (Node *)this->id;
        local_238 = local_184;
        kj::
        OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
        ::
        init<capnp::compiler::NodeTranslator::Resolver::ResolvedParameter,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                  ((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                    *)local_230,(ResolvedParameter *)&p);
        kj::
        Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
        ::Maybe(__return_storage_ptr__,
                (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                 *)local_230);
        params.reader.nestingLimit = 1;
        kj::
        OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
        ::~OneOf((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                  *)local_230);
        return __return_storage_ptr__;
      }
      kj::Range<unsigned_long>::Iterator::operator++(&__end2);
    }
    local_248 = kj::_::readMaybe<capnp::compiler::Compiler::Node>(&this->parent);
    if (local_248 == (Node *)0x0) {
      this_00 = CompiledModule::getCompiler(this->module);
      result_1.field_1._88_8_ = this_local;
      name_00.content.size_ = (size_t)name_local.content.ptr;
      name_00.content.ptr = (char *)this_local;
      local_268 = Compiler::Impl::lookupBuiltin(this_00,name_00);
      local_260 = kj::_::readMaybe<capnp::compiler::Compiler::Node>(&local_268);
      if (local_260 == (Node *)0x0) {
        kj::
        Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
        ::Maybe(__return_storage_ptr__,(void *)0x0);
      }
      else {
        kj::
        OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
        ::OneOf((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                 *)local_2e0);
        local_340.id = local_260->id;
        local_340.genericParamCount = local_260->genericParamCount;
        local_340.scopeId = 0;
        local_340.kind = local_260->kind;
        local_340.resolver = &local_260->super_Resolver;
        kj::Maybe<capnp::schema::Brand::Reader>::Maybe(&local_340.brand,(void *)0x0);
        kj::
        OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
        ::
        init<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedDecl>
                  ((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                    *)local_2e0,&local_340);
        NodeTranslator::Resolver::ResolvedDecl::~ResolvedDecl(&local_340);
        kj::
        Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
        ::Maybe(__return_storage_ptr__,
                (OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                 *)local_2e0);
        params.reader.nestingLimit = 1;
        kj::
        OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
        ::~OneOf((OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>
                  *)local_2e0);
      }
    }
    else {
      b = this_local;
      local_250 = name_local.content.ptr;
      name_01.content.size_ = (size_t)name_local.content.ptr;
      name_01.content.ptr = (char *)this_local;
      resolve(__return_storage_ptr__,local_248,name_01);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<NodeTranslator::Resolver::ResolveResult>
Compiler::Node::resolve(kj::StringPtr name) {
  // Check members.
  KJ_IF_MAYBE(member, resolveMember(name)) {
    return *member;
  }

  // Check parameters.
  // TODO(perf): Maintain a map?
  auto params = declaration.getParameters();
  for (uint i: kj::indices(params)) {
    if (params[i].getName() == name) {
      ResolveResult result;
      result.init<ResolvedParameter>(ResolvedParameter {id, i});
      return result;
    }
  }

  // Check parent scope.
  KJ_IF_MAYBE(p, parent) {
    return p->resolve(name);
  } else KJ_IF_MAYBE(b, module->getCompiler().lookupBuiltin(name)) {
    ResolveResult result;
    result.init<ResolvedDecl>(ResolvedDecl { b->id, b->genericParamCount, 0, b->kind, b, nullptr });
    return result;
  } else {
    return nullptr;
  }
}